

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall front::irGenerator::irGenerator::pushWhile(irGenerator *this,WhileLabels wl)

{
  value_type *in_RSI;
  vector<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  *unaff_retaddr;
  
  std::vector<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>::
  push_back(unaff_retaddr,in_RSI);
  return;
}

Assistant:

void irGenerator::pushWhile(WhileLabels wl) { _whileStack.push_back(wl); }